

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O0

iterator __thiscall
iffl::
flat_forward_list<_FILE_FULL_EA_INFORMATION,_iffl::flat_forward_list_traits<_FILE_FULL_EA_INFORMATION>,_std::allocator<_FILE_FULL_EA_INFORMATION>_>
::end(flat_forward_list<_FILE_FULL_EA_INFORMATION,_iffl::flat_forward_list_traits<_FILE_FULL_EA_INFORMATION>,_std::allocator<_FILE_FULL_EA_INFORMATION>_>
      *this)

{
  pointer_type pcVar1;
  buffer_type *pbVar2;
  size_t sVar3;
  flat_forward_list<_FILE_FULL_EA_INFORMATION,_iffl::flat_forward_list_traits<_FILE_FULL_EA_INFORMATION>,_std::allocator<_FILE_FULL_EA_INFORMATION>_>
  *in_RSI;
  size_with_padding<4UL> local_20;
  size_with_padding_t last_element_size;
  flat_forward_list<_FILE_FULL_EA_INFORMATION,_iffl::flat_forward_list_traits<_FILE_FULL_EA_INFORMATION>,_std::allocator<_FILE_FULL_EA_INFORMATION>_>
  *this_local;
  
  validate_pointer_invariants(in_RSI);
  pbVar2 = buff(in_RSI);
  if (pbVar2->last == (pointer_type)0x0) {
    memset(this,0,8);
    flat_forward_list_iterator_t<_FILE_FULL_EA_INFORMATION,_iffl::flat_forward_list_traits<_FILE_FULL_EA_INFORMATION>_>
    ::flat_forward_list_iterator_t
              ((flat_forward_list_iterator_t<_FILE_FULL_EA_INFORMATION,_iffl::flat_forward_list_traits<_FILE_FULL_EA_INFORMATION>_>
                *)this);
  }
  else {
    pbVar2 = buff(in_RSI);
    local_20.size =
         (size_t)flat_forward_list_traits_traits<_FILE_FULL_EA_INFORMATION,_iffl::flat_forward_list_traits<_FILE_FULL_EA_INFORMATION>_>
                 ::get_size(pbVar2->last);
    pbVar2 = buff(in_RSI);
    pcVar1 = pbVar2->last;
    sVar3 = size_with_padding<4UL>::size_padded(&local_20);
    flat_forward_list_iterator_t<_FILE_FULL_EA_INFORMATION,_iffl::flat_forward_list_traits<_FILE_FULL_EA_INFORMATION>_>
    ::flat_forward_list_iterator_t
              ((flat_forward_list_iterator_t<_FILE_FULL_EA_INFORMATION,_iffl::flat_forward_list_traits<_FILE_FULL_EA_INFORMATION>_>
                *)this,pcVar1 + sVar3);
  }
  return (iterator)(buffer_char_pointer)this;
}

Assistant:

iterator end() noexcept {
        validate_pointer_invariants();
        if (buff().last) {
            size_with_padding_t const last_element_size{ traits_traits::get_size(buff().last) };
            return iterator{ buff().last + last_element_size.size_padded() };
        } else {
            return iterator{ };
        }
    }